

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# flow_cutter.h
# Opt level: O0

void __thiscall
flow_cutter::BasicCutter::
init<flow_cutter::Graph<ConstRefIDIDFunc<ArrayIDIDFunc>,ConstRefIDIDFunc<ArrayIDIDFunc>,ConstRefIDIDFunc<ArrayIDIDFunc>,ConstIntIDFunc<1>,ConstRefIDFunc<RangeIDIDMultiFunc>>,flow_cutter::PseudoDepthFirstSearch>
          (BasicCutter *this,
          Graph<ConstRefIDIDFunc<ArrayIDIDFunc>,_ConstRefIDIDFunc<ArrayIDIDFunc>,_ConstRefIDIDFunc<ArrayIDIDFunc>,_ConstIntIDFunc<1>,_ConstRefIDFunc<RangeIDIDMultiFunc>_>
          *graph,TemporaryData *tmp,PseudoDepthFirstSearch *search_algo,SourceTargetPair p,
          int max_flow_intensity)

{
  Graph<ConstRefIDIDFunc<ArrayIDIDFunc>,_ConstRefIDIDFunc<ArrayIDIDFunc>,_ConstRefIDIDFunc<ArrayIDIDFunc>,_ConstIntIDFunc<1>,_ConstRefIDFunc<RangeIDIDMultiFunc>_>
  *in_RSI;
  BasicCutter *in_RDI;
  int in_R9D;
  PseudoDepthFirstSearch *in_stack_00000048;
  TemporaryData *in_stack_00000050;
  Graph<ConstRefIDIDFunc<ArrayIDIDFunc>,_ConstRefIDIDFunc<ArrayIDIDFunc>,_ConstRefIDIDFunc<ArrayIDIDFunc>,_ConstIntIDFunc<1>,_ConstRefIDFunc<RangeIDIDMultiFunc>_>
  *in_stack_00000058;
  BasicCutter *in_stack_00000060;
  int in_stack_00000084;
  PseudoDepthFirstSearch *in_stack_00000088;
  TemporaryData *in_stack_00000090;
  Graph<ConstRefIDIDFunc<ArrayIDIDFunc>,_ConstRefIDIDFunc<ArrayIDIDFunc>,_ConstRefIDIDFunc<ArrayIDIDFunc>,_ConstIntIDFunc<1>,_ConstRefIDFunc<RangeIDIDMultiFunc>_>
  *in_stack_00000098;
  BasicCutter *in_stack_000000a0;
  undefined4 in_stack_ffffffffffffffd0;
  
  AssimilatedNodeSet::clear((AssimilatedNodeSet *)CONCAT44(in_R9D,in_stack_ffffffffffffffd0));
  ReachableNodeSet::clear((ReachableNodeSet *)0x16fe50);
  AssimilatedNodeSet::clear((AssimilatedNodeSet *)CONCAT44(in_R9D,in_stack_ffffffffffffffd0));
  ReachableNodeSet::clear((ReachableNodeSet *)0x16fe71);
  UnitFlow::clear((UnitFlow *)0x16fe81);
  in_RDI->flow_intensity = 0;
  in_RDI->max_flow_intensity = in_R9D;
  AssimilatedNodeSet::
  set_extra_node<flow_cutter::Graph<ConstRefIDIDFunc<ArrayIDIDFunc>,ConstRefIDIDFunc<ArrayIDIDFunc>,ConstRefIDIDFunc<ArrayIDIDFunc>,ConstIntIDFunc<1>,ConstRefIDFunc<RangeIDIDMultiFunc>>>
            ((AssimilatedNodeSet *)CONCAT44(in_R9D,in_stack_ffffffffffffffd0),
             (Graph<ConstRefIDIDFunc<ArrayIDIDFunc>,_ConstRefIDIDFunc<ArrayIDIDFunc>,_ConstRefIDIDFunc<ArrayIDIDFunc>,_ConstIntIDFunc<1>,_ConstRefIDFunc<RangeIDIDMultiFunc>_>
              *)in_RDI,0);
  ReachableNodeSet::
  set_extra_node<flow_cutter::Graph<ConstRefIDIDFunc<ArrayIDIDFunc>,ConstRefIDIDFunc<ArrayIDIDFunc>,ConstRefIDIDFunc<ArrayIDIDFunc>,ConstIntIDFunc<1>,ConstRefIDFunc<RangeIDIDMultiFunc>>>
            ((ReachableNodeSet *)CONCAT44(in_R9D,in_stack_ffffffffffffffd0),
             (Graph<ConstRefIDIDFunc<ArrayIDIDFunc>,_ConstRefIDIDFunc<ArrayIDIDFunc>,_ConstRefIDIDFunc<ArrayIDIDFunc>,_ConstIntIDFunc<1>,_ConstRefIDFunc<RangeIDIDMultiFunc>_>
              *)in_RDI,0);
  AssimilatedNodeSet::
  set_extra_node<flow_cutter::Graph<ConstRefIDIDFunc<ArrayIDIDFunc>,ConstRefIDIDFunc<ArrayIDIDFunc>,ConstRefIDIDFunc<ArrayIDIDFunc>,ConstIntIDFunc<1>,ConstRefIDFunc<RangeIDIDMultiFunc>>>
            ((AssimilatedNodeSet *)CONCAT44(in_R9D,in_stack_ffffffffffffffd0),
             (Graph<ConstRefIDIDFunc<ArrayIDIDFunc>,_ConstRefIDIDFunc<ArrayIDIDFunc>,_ConstRefIDIDFunc<ArrayIDIDFunc>,_ConstIntIDFunc<1>,_ConstRefIDFunc<RangeIDIDMultiFunc>_>
              *)in_RDI,0);
  ReachableNodeSet::
  set_extra_node<flow_cutter::Graph<ConstRefIDIDFunc<ArrayIDIDFunc>,ConstRefIDIDFunc<ArrayIDIDFunc>,ConstRefIDIDFunc<ArrayIDIDFunc>,ConstIntIDFunc<1>,ConstRefIDFunc<RangeIDIDMultiFunc>>>
            ((ReachableNodeSet *)CONCAT44(in_R9D,in_stack_ffffffffffffffd0),
             (Graph<ConstRefIDIDFunc<ArrayIDIDFunc>,_ConstRefIDIDFunc<ArrayIDIDFunc>,_ConstRefIDIDFunc<ArrayIDIDFunc>,_ConstIntIDFunc<1>,_ConstRefIDFunc<RangeIDIDMultiFunc>_>
              *)in_RDI,0);
  grow_reachable_sets<flow_cutter::Graph<ConstRefIDIDFunc<ArrayIDIDFunc>,ConstRefIDIDFunc<ArrayIDIDFunc>,ConstRefIDIDFunc<ArrayIDIDFunc>,ConstIntIDFunc<1>,ConstRefIDFunc<RangeIDIDMultiFunc>>,flow_cutter::PseudoDepthFirstSearch>
            (in_stack_000000a0,in_stack_00000098,in_stack_00000090,in_stack_00000088,
             in_stack_00000084);
  grow_assimilated_sets<flow_cutter::Graph<ConstRefIDIDFunc<ArrayIDIDFunc>,ConstRefIDIDFunc<ArrayIDIDFunc>,ConstRefIDIDFunc<ArrayIDIDFunc>,ConstIntIDFunc<1>,ConstRefIDFunc<RangeIDIDMultiFunc>>,flow_cutter::PseudoDepthFirstSearch>
            (in_stack_00000060,in_stack_00000058,in_stack_00000050,in_stack_00000048);
  in_RDI->cut_available = true;
  check_invariants<flow_cutter::Graph<ConstRefIDIDFunc<ArrayIDIDFunc>,ConstRefIDIDFunc<ArrayIDIDFunc>,ConstRefIDIDFunc<ArrayIDIDFunc>,ConstIntIDFunc<1>,ConstRefIDFunc<RangeIDIDMultiFunc>>>
            (in_RDI,in_RSI);
  return;
}

Assistant:

void init(const Graph& graph, TemporaryData& tmp,
        const SearchAlgorithm& search_algo, SourceTargetPair p,
        int max_flow_intensity
    )
    {
        assimilated[source_side].clear();
        reachable[source_side].clear();
        assimilated[target_side].clear();
        reachable[target_side].clear();
        flow.clear();

        flow_intensity = 0;
        this->max_flow_intensity = max_flow_intensity;

        assimilated[source_side].set_extra_node(graph, p.source);
        reachable[source_side].set_extra_node(graph, p.source);
        assimilated[target_side].set_extra_node(graph, p.target);
        reachable[target_side].set_extra_node(graph, p.target);

        grow_reachable_sets(graph, tmp, search_algo, source_side);
        grow_assimilated_sets(graph, tmp, search_algo);

        cut_available = true;
        check_invariants(graph);
    }